

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::ListSceneNames
               (Prim *root,
               vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *sceneNames)

{
  Specifier SVar1;
  pointer pPVar2;
  long lVar3;
  PrimMeta *pPVar4;
  char *__function;
  pointer this;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((sceneNames !=
       (vector<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0) && (pPVar4 = Prim::metas(root), (pPVar4->kind).has_value_ == true)) {
    pPVar4 = Prim::metas(root);
    if ((pPVar4->kind).has_value_ == false) {
      __function = 
      "const value_type &nonstd::optional_lite::optional<tinyusdz::Kind>::value() const [T = tinyusdz::Kind]"
      ;
LAB_004d0b57:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,__function);
    }
    if ((pPVar4->kind).contained == (storage_t<tinyusdz::Kind>)0x5) {
      this = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this == pPVar2) {
        return true;
      }
      do {
        pPVar4 = Prim::metas(this);
        if ((pPVar4->sceneName).has_value_ == true) {
          SVar1 = this->_specifier;
          pPVar4 = Prim::metas(this);
          if ((pPVar4->sceneName).has_value_ == false) {
            __function = 
            "const value_type &nonstd::optional_lite::optional<std::basic_string<char>>::value() const [T = std::basic_string<char>]"
            ;
            goto LAB_004d0b57;
          }
          local_58[0] = SVar1 == Over;
          lVar3 = *(long *)&(pPVar4->sceneName).contained;
          local_50._M_p = (pointer)&local_40;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,lVar3,
                     *(long *)((long)&(pPVar4->sceneName).contained + 8) + lVar3);
          ::std::
          vector<std::pair<bool,std::__cxx11::string>,std::allocator<std::pair<bool,std::__cxx11::string>>>
          ::emplace_back<std::pair<bool,std::__cxx11::string>>
                    ((vector<std::pair<bool,std::__cxx11::string>,std::allocator<std::pair<bool,std::__cxx11::string>>>
                      *)sceneNames,
                     (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_p != &local_40) {
            operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
          }
        }
        this = this + 1;
        if (this == pPVar2) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool ListSceneNames(const tinyusdz::Prim &root,
                    std::vector<std::pair<bool, std::string>> *sceneNames) {
  if (!sceneNames) {
    return false;
  }

  bool has_sceneLibrary = false;
  if (root.metas().kind.has_value()) {
    if (root.metas().kind.value() == Kind::SceneLibrary) {
      // ok
      has_sceneLibrary = true;
    }
  }

  if (!has_sceneLibrary) {
    return false;
  }

  for (const Prim &child : root.children()) {
    if (!ListSceneNamesRec(child, /* depth */ 0, sceneNames)) {
      return false;
    }
  }

  return true;
}